

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<bool> __thiscall
kj::anon_unknown_31::HttpInputStreamImpl::awaitNextMessage(HttpInputStreamImpl *this)

{
  Disposer *pDVar1;
  PromiseNode *pPVar2;
  AsyncInputStream *pAVar3;
  EventLoop *pEVar4;
  TransformPromiseNodeBase *pTVar5;
  ImmediatePromiseNode<bool> *pIVar6;
  ImmediatePromiseNode<bool> *extraout_RDX;
  ImmediatePromiseNode<bool> *extraout_RDX_00;
  ImmediatePromiseNode<bool> *extraout_RDX_01;
  ImmediatePromiseNode<bool> *extraout_RDX_02;
  HttpInputStreamImpl *in_RSI;
  Promise<void> PVar7;
  Own<kj::_::ChainPromiseNode> OVar8;
  Own<kj::_::ImmediatePromiseNode<bool>_> OVar9;
  Promise<bool> PVar10;
  ForkedPromise<void> fork;
  Own<kj::_::PromiseNode> local_58;
  Own<kj::_::PromiseNode> local_48;
  undefined1 local_38 [8];
  AsyncInputStream *pAStack_30;
  undefined1 local_28 [8];
  EventLoop *local_20;
  
  if ((in_RSI->onMessageDone).ptr.ptr == (PromiseFulfiller<void> *)0x0) {
    snarfBufferedLineBreak(in_RSI);
    if ((in_RSI->lineBreakBeforeNextHeader == false) && ((in_RSI->leftover).size_ != 0)) {
      local_48.disposer = (Disposer *)CONCAT71(local_48.disposer._1_7_,1);
      OVar9 = heap<kj::_::ImmediatePromiseNode<bool>,bool>((kj *)local_38,(bool *)&local_48);
      pIVar6 = OVar9.ptr;
      (this->super_HttpInputStream)._vptr_HttpInputStream =
           (_func_int **)CONCAT44(local_38._4_4_,local_38._0_4_);
      this->inner = pAStack_30;
      goto LAB_002c4ec0;
    }
    (*in_RSI->inner->_vptr_AsyncInputStream[1])
              (&local_58,in_RSI->inner,(in_RSI->headerBuffer).ptr,1,(in_RSI->headerBuffer).size_);
    pTVar5 = (TransformPromiseNodeBase *)operator_new(0x30);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar5,&local_58,
               _::
               TransformPromiseNode<kj::Promise<bool>,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:1093:15),_kj::_::PropagateException>
               ::anon_class_8_1_8991fb9c_for_func::operator());
    (pTVar5->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0045ea00;
    pTVar5[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)in_RSI;
    local_48.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<bool>,unsigned_long,kj::(anonymous_namespace)::HttpInputStreamImpl::awaitNextMessage()::{lambda(unsigned_long)#1},kj::_::PropagateException>>
          ::instance;
    local_48.ptr = (PromiseNode *)pTVar5;
    OVar8 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)local_38,&local_48);
    pPVar2 = local_48.ptr;
    pIVar6 = (ImmediatePromiseNode<bool> *)OVar8.ptr;
    *(undefined4 *)&(this->super_HttpInputStream)._vptr_HttpInputStream = local_38._0_4_;
    *(undefined4 *)((long)&(this->super_HttpInputStream)._vptr_HttpInputStream + 4) = local_38._4_4_
    ;
    *(uint *)&this->inner = (uint)pAStack_30;
    *(undefined4 *)((long)&this->inner + 4) = pAStack_30._4_4_;
    if ((TransformPromiseNodeBase *)local_48.ptr != (TransformPromiseNodeBase *)0x0) {
      local_48.ptr = (PromiseNode *)0x0;
      (**(local_48.disposer)->_vptr_Disposer)
                (local_48.disposer,
                 (_func_int *)
                 ((long)&((PromiseNode *)&pPVar2->_vptr_PromiseNode)->_vptr_PromiseNode +
                 (long)((PromiseNode *)&pPVar2->_vptr_PromiseNode)->_vptr_PromiseNode[-2]));
      pIVar6 = extraout_RDX_01;
    }
  }
  else {
    Promise<void>::fork((Promise<void> *)&local_58);
    PVar7 = _::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_38);
    pDVar1 = (in_RSI->messageReadQueue).super_PromiseBase.node.disposer;
    pPVar2 = (in_RSI->messageReadQueue).super_PromiseBase.node.ptr;
    (in_RSI->messageReadQueue).super_PromiseBase.node.disposer =
         (Disposer *)CONCAT44(local_38._4_4_,local_38._0_4_);
    (in_RSI->messageReadQueue).super_PromiseBase.node.ptr = (PromiseNode *)pAStack_30;
    pAStack_30 = (AsyncInputStream *)0x0;
    if (pPVar2 != (PromiseNode *)0x0) {
      (**pDVar1->_vptr_Disposer)
                (pDVar1,(_func_int *)
                        ((long)&pPVar2->_vptr_PromiseNode + (long)pPVar2->_vptr_PromiseNode[-2]),
                 PVar7.super_PromiseBase.node.ptr);
    }
    pAVar3 = pAStack_30;
    if (pAStack_30 != (AsyncInputStream *)0x0) {
      pAStack_30 = (AsyncInputStream *)0x0;
      (*(code *)**(undefined8 **)CONCAT44(local_38._4_4_,local_38._0_4_))
                ((undefined8 *)CONCAT44(local_38._4_4_,local_38._0_4_),
                 (_func_int *)
                 ((long)&pAVar3->_vptr_AsyncInputStream + (long)pAVar3->_vptr_AsyncInputStream[-2]))
      ;
    }
    _::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_28);
    pTVar5 = (TransformPromiseNodeBase *)operator_new(0x30);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar5,(Own<kj::_::PromiseNode> *)local_28,
               _::
               TransformPromiseNode<kj::Promise<bool>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:1081:36),_kj::_::PropagateException>
               ::anon_class_8_1_8991fb9c_for_func::operator());
    (pTVar5->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0045e978;
    pTVar5[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)in_RSI;
    local_48.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<bool>,kj::_::Void,kj::(anonymous_namespace)::HttpInputStreamImpl::awaitNextMessage()::{lambda()#1},kj::_::PropagateException>>
          ::instance;
    local_48.ptr = (PromiseNode *)pTVar5;
    OVar8 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)local_38,&local_48);
    pPVar2 = local_48.ptr;
    pIVar6 = (ImmediatePromiseNode<bool> *)OVar8.ptr;
    *(undefined4 *)&(this->super_HttpInputStream)._vptr_HttpInputStream = local_38._0_4_;
    *(undefined4 *)((long)&(this->super_HttpInputStream)._vptr_HttpInputStream + 4) = local_38._4_4_
    ;
    *(uint *)&this->inner = (uint)pAStack_30;
    *(undefined4 *)((long)&this->inner + 4) = pAStack_30._4_4_;
    if ((TransformPromiseNodeBase *)local_48.ptr != (TransformPromiseNodeBase *)0x0) {
      local_48.ptr = (PromiseNode *)0x0;
      (**(local_48.disposer)->_vptr_Disposer)
                (local_48.disposer,
                 (_func_int *)
                 ((long)&((PromiseNode *)&pPVar2->_vptr_PromiseNode)->_vptr_PromiseNode +
                 (long)((PromiseNode *)&pPVar2->_vptr_PromiseNode)->_vptr_PromiseNode[-2]));
      pIVar6 = extraout_RDX;
    }
    pEVar4 = local_20;
    if (local_20 != (EventLoop *)0x0) {
      local_20 = (EventLoop *)0x0;
      (**(code **)*(_func_int **)local_28)
                (local_28,(long)&pEVar4->port + (long)pEVar4->port[-2]._vptr_EventPort);
      pIVar6 = extraout_RDX_00;
    }
  }
  pPVar2 = local_58.ptr;
  if (local_58.ptr != (PromiseNode *)0x0) {
    local_58.ptr = (PromiseNode *)0x0;
    (**(local_58.disposer)->_vptr_Disposer)
              (local_58.disposer,
               (_func_int *)((long)&pPVar2->_vptr_PromiseNode + (long)pPVar2->_vptr_PromiseNode[-2])
              );
    pIVar6 = extraout_RDX_02;
  }
LAB_002c4ec0:
  PVar10.super_PromiseBase.node.ptr = (PromiseNode *)pIVar6;
  PVar10.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<bool>)PVar10.super_PromiseBase.node;
}

Assistant:

kj::Promise<bool> awaitNextMessage() override {
    // Waits until more data is available, but doesn't consume it. Returns false on EOF.
    //
    // Used on the server after a request is handled, to check for pipelined requests.
    //
    // Used on the client to detect when idle connections are closed from the server end. (In this
    // case, the promise always returns false or is canceled.)

    if (onMessageDone != nullptr) {
      // We're still working on reading the previous body.
      auto fork = messageReadQueue.fork();
      messageReadQueue = fork.addBranch();
      return fork.addBranch().then([this]() {
        return awaitNextMessage();
      });
    }

    snarfBufferedLineBreak();

    if (!lineBreakBeforeNextHeader && leftover != nullptr) {
      return true;
    }

    return inner.tryRead(headerBuffer.begin(), 1, headerBuffer.size())
        .then([this](size_t amount) -> kj::Promise<bool> {
      if (amount > 0) {
        leftover = headerBuffer.slice(0, amount);
        return awaitNextMessage();
      } else {
        return false;
      }
    });
  }